

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  long lVar5;
  uint8_t *puVar6;
  undefined2 *puVar7;
  undefined2 *puVar8;
  int iVar9;
  long lVar10;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    uVar2 = peVar4->width;
    lVar5 = (long)(int)uVar2;
    puVar6 = peVar4[2].field_12.decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    puVar8 = (undefined2 *)decode->unpacked_buffer;
    iVar9 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar10 = 0;
        puVar7 = puVar8;
        do {
          *(undefined2 *)(puVar6 + lVar10) = puVar7[lVar5 * 2];
          *(undefined2 *)(puVar6 + lVar10 + 2) = puVar7[lVar5];
          *(undefined2 *)(puVar6 + lVar10 + 4) = *puVar7;
          puVar7 = puVar7 + 1;
          lVar10 = lVar10 + 6;
        } while ((ulong)uVar2 * 6 != lVar10);
      }
      puVar8 = puVar8 + lVar5 * 3;
      puVar6 = puVar6 + iVar3;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer; // B
        in1 = in0 + w;                     // G
        in2 = in1 + w;                     // R

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in2[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in0[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}